

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O3

void __thiscall
embree::sse2::
BVHNBuilderFastSpatialSAH<4,_embree::TriangleMesh,_embree::TriangleMi<4>,_embree::sse2::TriangleSplitterFactory>
::BVHNBuilderFastSpatialSAH
          (BVHNBuilderFastSpatialSAH<4,_embree::TriangleMesh,_embree::TriangleMi<4>,_embree::sse2::TriangleSplitterFactory>
           *this,BVH *bvh,Scene *scene,size_t sahBlockSize,float intCost,size_t minLeafSize,
          size_t maxLeafSize,size_t mode)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  MemoryMonitorInterface *pMVar4;
  
  (this->super_Builder).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Builder).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__BVHNBuilderFastSpatialSAH_0218d868;
  this->bvh = bvh;
  this->scene = scene;
  this->mesh = (TriangleMesh *)0x0;
  lVar1 = *(long *)&(scene->super_AccelN).field_0x188;
  pMVar4 = (MemoryMonitorInterface *)(lVar1 + 0x550);
  if (lVar1 == 0) {
    pMVar4 = (MemoryMonitorInterface *)0x0;
  }
  (this->prims0).alloc.device = pMVar4;
  (this->prims0).alloc.hugepages = false;
  uVar3 = 0x1c;
  if (maxLeafSize < 0x1c) {
    uVar3 = maxLeafSize;
  }
  (this->prims0).size_active = 0;
  (this->prims0).size_alloced = 0;
  (this->prims0).items = (PrimRef *)0x0;
  (this->settings).branchingFactor = 2;
  (this->settings).maxDepth = 0x20;
  sVar2 = 0x3f;
  if (sahBlockSize != 0) {
    for (; sahBlockSize >> sVar2 == 0; sVar2 = sVar2 - 1) {
    }
  }
  if (uVar3 <= minLeafSize) {
    minLeafSize = uVar3;
  }
  (this->settings).logBlockSize = sVar2;
  (this->settings).minLeafSize = minLeafSize;
  (this->settings).maxLeafSize = uVar3;
  (this->settings).travCost = 1.0;
  (this->settings).intCost = intCost;
  (this->settings).singleThreadThreshold = 0x400;
  (this->settings).primrefarrayalloc = 0xffffffffffffffff;
  this->splitFactor = *(float *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x460);
  this->geomID_ = 0xffffffff;
  this->numPreviousPrimitives = 0;
  return;
}

Assistant:

BVHNBuilderFastSpatialSAH (BVH* bvh, Scene* scene, const size_t sahBlockSize, const float intCost, const size_t minLeafSize, const size_t maxLeafSize, const size_t mode)
        : bvh(bvh), scene(scene), mesh(nullptr), prims0(scene->device,0), settings(sahBlockSize, minLeafSize, min(maxLeafSize,Primitive::max_size()*BVH::maxLeafBlocks), travCost, intCost, DEFAULT_SINGLE_THREAD_THRESHOLD),
          splitFactor(scene->device->max_spatial_split_replications) {}